

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,cmValue *loc,cmValue *imp,string *suffix)

{
  int iVar1;
  long *plVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  bool bVar6;
  cmValue cVar7;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var8;
  char *pcVar9;
  string *psVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  undefined8 uVar12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  string mcUpper;
  string mapProp;
  string locProp;
  string locPropBase;
  cmList availableConfigs;
  cmList mappedConfigs;
  string config_upper;
  bool local_181;
  undefined1 local_168 [32];
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  undefined8 local_120;
  size_type local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  undefined8 local_108;
  undefined1 local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  string *local_d8;
  undefined1 local_c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40;
  local_48 = 0;
  local_40 = '\0';
  if (desired_config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_148,desired_config);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  local_a8._M_allocated_capacity = (size_type)&local_98;
  local_a8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_98._M_local_buf[0] = '\0';
  iVar1 = ((this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
  if (iVar1 == 4) {
    pcVar9 = "IMPORTED_OBJECTS";
  }
  else if (iVar1 == 7) {
    pcVar9 = "IMPORTED_LIBNAME";
  }
  else {
    pcVar9 = "IMPORTED_LOCATION";
  }
  std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)0x0,(ulong)pcVar9);
  local_148.field_2._M_allocated_capacity = (long)&local_148.field_2 + 8;
  local_148._M_dataplus._M_p = (pointer)0x0;
  local_148._M_string_length = 1;
  local_148.field_2._M_local_buf[8] = 0x5f;
  local_100._0_8_ = (pointer)0x1;
  local_100._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_100._24_8_ = local_48;
  local_e0 = local_50;
  local_d8 = (string *)0x0;
  views._M_len = 2;
  views._M_array = (iterator)local_100;
  local_100._8_8_ = local_148.field_2._M_allocated_capacity;
  cmCatViews((string *)local_168,views);
  std::__cxx11::string::operator=((string *)suffix,(string *)local_168);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_168 + 0x10)) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
  }
  local_58 = 0;
  local_68._M_allocated_capacity = 0;
  local_68._8_8_ = (string *)0x0;
  local_148._M_dataplus._M_p = &DAT_00000014;
  local_148._M_string_length = 0x7da8a6;
  local_148.field_2._M_allocated_capacity = 0;
  local_148.field_2._8_8_ = local_48;
  local_128 = local_50;
  local_120 = 0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)&local_148;
  cmCatViews((string *)local_100,views_00);
  cVar7 = GetProperty(this,(string *)local_100);
  uVar3 = local_68._8_8_;
  uVar12 = local_68._M_allocated_capacity;
  if (cVar7.Value != (string *)0x0) {
    if (local_68._8_8_ != local_68._M_allocated_capacity) {
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_68._M_allocated_capacity + 0x10);
      do {
        plVar2 = (long *)(((string *)(paVar11 + -1))->_M_dataplus)._M_p;
        if (paVar11 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar2) {
          operator_delete(plVar2,paVar11->_M_allocated_capacity + 1);
        }
        psVar10 = (string *)(paVar11 + 1);
        paVar11 = paVar11 + 2;
      } while (psVar10 != (string *)uVar3);
      local_68._8_8_ = uVar12;
    }
    cmList::Insert((container_type *)&local_68,(const_iterator)local_68._8_8_,cVar7.Value,Yes,Yes);
  }
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
  }
  local_181 = true;
  bVar6 = true;
  if (((this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType != 2) {
    bVar5 = IsExecutableWithExports(this);
    bVar6 = true;
    if (!bVar5) {
      _Var8._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      if ((_Var8._M_head_impl)->IsAIX == true) {
        bVar5 = IsExecutableWithExports(this);
        bVar6 = true;
        if (bVar5) goto LAB_0024a8a1;
        _Var8._M_head_impl =
             (this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      }
      bVar6 = cmMakefile::PlatformSupportsAppleTextStubs((_Var8._M_head_impl)->Makefile);
      if (bVar6) {
        bVar6 = IsSharedLibraryWithExports(this);
      }
      else {
        bVar6 = false;
      }
    }
  }
LAB_0024a8a1:
  psVar10 = loc->Value;
  _Var4._M_p = local_148._M_dataplus._M_p;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_string_length;
  local_148._M_string_length = local_a8._M_allocated_capacity;
  local_148._M_dataplus._M_p = (pointer)local_a8._8_8_;
  uVar12 = local_68._M_allocated_capacity;
  do {
    local_a8._M_allocated_capacity = local_148._M_string_length;
    local_a8._8_8_ = local_148._M_dataplus._M_p;
    if (psVar10 != (string *)0x0) {
LAB_0024b0a0:
      local_148._M_string_length = (size_type)paVar11;
      local_148._M_dataplus._M_p = _Var4._M_p;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_allocated_capacity != &local_98) {
        operator_delete((void *)local_a8._M_allocated_capacity,
                        CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]) + 1)
        ;
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40
         ) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      return local_181;
    }
    psVar10 = imp->Value;
    if ((psVar10 != (string *)0x0) || (uVar12 == local_68._8_8_)) {
      if (local_68._M_allocated_capacity == local_68._8_8_) {
        if (psVar10 != (string *)0x0) goto LAB_0024abc9;
        local_148.field_2._M_allocated_capacity = 0;
        local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (suffix->_M_dataplus)._M_p;
        local_148.field_2._8_8_ = suffix->_M_string_length;
        local_120 = 0;
        views_04._M_len = 2;
        views_04._M_array = (iterator)&local_148;
        cmCatViews((string *)local_100,views_04);
        cVar7 = GetProperty(this,(string *)local_100);
        loc->Value = (string *)cVar7;
        if (bVar6 != false) {
          local_148._M_dataplus._M_p = (pointer)0xf;
          local_148._M_string_length = 0x7dbb88;
          local_148.field_2._M_allocated_capacity = 0;
          local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (suffix->_M_dataplus)._M_p;
          local_148.field_2._8_8_ = suffix->_M_string_length;
          local_120 = 0;
          views_05._M_len = 2;
          views_05._M_array = (iterator)&local_148;
          cmCatViews((string *)local_168,views_05);
          cVar7 = GetProperty(this,(string *)local_168);
          imp->Value = (string *)cVar7;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
          }
        }
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
        }
        bVar5 = loc->Value != (string *)0x0;
        _Var4._M_p = local_148._M_dataplus._M_p;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_string_length;
      }
      else {
        if (psVar10 == (string *)0x0) goto LAB_0024b090;
LAB_0024abc9:
        bVar5 = false;
      }
      local_148._M_string_length = (size_type)paVar11;
      local_148._M_dataplus._M_p = _Var4._M_p;
      _Var4._M_p = local_148._M_dataplus._M_p;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_string_length;
      if ((!bVar5) && (imp->Value == (string *)0x0)) {
        suffix->_M_string_length = 0;
        *(suffix->_M_dataplus)._M_p = '\0';
        cVar7 = GetProperty(this,(string *)&local_a8);
        loc->Value = (string *)cVar7;
        if (bVar6 != false) {
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"IMPORTED_IMPLIB","")
          ;
          cVar7 = GetProperty(this,&local_148);
          imp->Value = (string *)cVar7;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          cVar7 = (cmValue)loc->Value;
        }
        psVar10 = imp->Value;
        if (psVar10 == (string *)0x0 && cVar7.Value == (string *)0x0) {
          local_88._0_8_ = (string *)0x0;
          local_88._8_8_ = (string *)0x0;
          local_88._16_8_ = 0;
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_148,"IMPORTED_CONFIGURATIONS","");
          cVar7 = GetProperty(this,&local_148);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          uVar3 = local_88._8_8_;
          uVar12 = local_88._0_8_;
          if (cVar7.Value != (string *)0x0) {
            if (local_88._8_8_ != local_88._0_8_) {
              paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_88._0_8_ + 0x10);
              do {
                plVar2 = (long *)(((string *)(paVar11 + -1))->_M_dataplus)._M_p;
                if (paVar11 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
                  operator_delete(plVar2,paVar11->_M_allocated_capacity + 1);
                }
                psVar10 = (string *)(paVar11 + 1);
                paVar11 = paVar11 + 2;
              } while (psVar10 != (string *)uVar3);
              local_88._8_8_ = uVar12;
            }
            cmList::Insert((container_type *)local_88,(const_iterator)local_88._8_8_,cVar7.Value,Yes
                           ,No);
          }
          if (((loc->Value == (string *)0x0) && (imp->Value == (string *)0x0)) &&
             (local_88._0_8_ != local_88._8_8_)) {
            psVar10 = (string *)local_88._0_8_;
            do {
              cmsys::SystemTools::UpperCase((string *)local_c8,psVar10);
              local_148._M_dataplus._M_p = (pointer)0x0;
              local_148._M_string_length = 1;
              local_148.field_2._M_allocated_capacity = (long)&local_148.field_2 + 8;
              local_148.field_2._M_local_buf[8] = 0x5f;
              local_100._0_8_ = (pointer)0x1;
              local_100._16_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_100._24_8_ = local_c8._8_8_;
              local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8._0_8_;
              views_06._M_len = 2;
              views_06._M_array = (iterator)local_100;
              local_100._8_8_ = local_148.field_2._M_allocated_capacity;
              local_d8 = (string *)local_c8;
              cmCatViews((string *)local_168,views_06);
              std::__cxx11::string::operator=((string *)suffix,(string *)local_168);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_168._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_168 + 0x10)) {
                operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_c8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_c8 + 0x10)) {
                operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
              }
              local_148._M_dataplus._M_p = (pointer)local_a8._8_8_;
              local_148._M_string_length = local_a8._M_allocated_capacity;
              local_148.field_2._M_allocated_capacity = 0;
              local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (suffix->_M_dataplus)._M_p;
              local_148.field_2._8_8_ = suffix->_M_string_length;
              local_120 = 0;
              views_07._M_len = 2;
              views_07._M_array = (iterator)&local_148;
              cmCatViews((string *)local_100,views_07);
              cVar7 = GetProperty(this,(string *)local_100);
              loc->Value = (string *)cVar7;
              if (bVar6 != false) {
                local_148._M_dataplus._M_p = (pointer)0xf;
                local_148._M_string_length = 0x7dbb88;
                local_148.field_2._M_allocated_capacity = 0;
                local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (suffix->_M_dataplus)._M_p;
                local_148.field_2._8_8_ = suffix->_M_string_length;
                local_120 = 0;
                views_08._M_len = 2;
                views_08._M_array = (iterator)&local_148;
                cmCatViews((string *)local_168,views_08);
                cVar7 = GetProperty(this,(string *)local_168);
                imp->Value = (string *)cVar7;
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_168._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_168 + 0x10)) {
                  operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
                }
              }
              if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
                operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
              }
            } while (((loc->Value == (string *)0x0) && (imp->Value == (string *)0x0)) &&
                    (psVar10 = psVar10 + 1, psVar10 != (string *)local_88._8_8_));
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_88);
          cVar7 = (cmValue)loc->Value;
          psVar10 = imp->Value;
        }
        _Var4._M_p = local_148._M_dataplus._M_p;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_string_length;
        if (psVar10 == (string *)0x0 && cVar7.Value == (string *)0x0) {
LAB_0024b090:
          local_148._M_string_length = (size_type)paVar11;
          local_148._M_dataplus._M_p = _Var4._M_p;
          local_181 = ((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType
                      == 7;
          _Var4._M_p = local_148._M_dataplus._M_p;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_string_length;
        }
      }
      goto LAB_0024b0a0;
    }
    local_148._M_dataplus._M_p = _Var4._M_p;
    local_148._M_string_length = (size_type)paVar11;
    if (((string *)uVar12)->_M_string_length == 0) {
      cVar7 = GetProperty(this,(string *)&local_a8);
      loc->Value = (string *)cVar7;
      if (bVar6 != false) {
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"IMPORTED_IMPLIB","");
        cVar7 = GetProperty(this,&local_148);
        imp->Value = (string *)cVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        cVar7 = (cmValue)loc->Value;
      }
      if (cVar7.Value != (string *)0x0 || imp->Value != (string *)0x0) {
        suffix->_M_string_length = 0;
        *(suffix->_M_dataplus)._M_p = '\0';
      }
    }
    else {
      cmsys::SystemTools::UpperCase((string *)local_168,(string *)uVar12);
      local_148._M_dataplus._M_p = (pointer)local_a8._8_8_;
      local_148._M_string_length = local_a8._M_allocated_capacity;
      local_148.field_2._M_allocated_capacity = 0;
      local_100._0_8_ = (pointer)0x0;
      local_100._8_8_ = (char *)0x1;
      local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_100 + 0x18);
      local_100[0x18] = 0x5f;
      local_148.field_2._8_8_ = 1;
      local_120 = 0;
      local_118 = local_168._8_8_;
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_168._0_8_;
      local_108 = 0;
      views_01._M_len = 3;
      views_01._M_array = (iterator)&local_148;
      local_100._16_8_ = local_128;
      cmCatViews((string *)local_c8,views_01);
      cVar7 = GetProperty(this,(string *)local_c8);
      loc->Value = (string *)cVar7;
      if (bVar6 != false) {
        local_148._M_dataplus._M_p = (pointer)0x10;
        local_148._M_string_length = 0x7db5ea;
        local_148.field_2._M_allocated_capacity = 0;
        local_148.field_2._8_8_ = local_168._8_8_;
        local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_168._0_8_;
        local_120 = 0;
        views_02._M_len = 2;
        views_02._M_array = (iterator)&local_148;
        cmCatViews((string *)local_100,views_02);
        cVar7 = GetProperty(this,(string *)local_100);
        imp->Value = (string *)cVar7;
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
        }
        cVar7 = (cmValue)loc->Value;
      }
      if (cVar7.Value != (string *)0x0 || imp->Value != (string *)0x0) {
        local_148._M_dataplus._M_p = (pointer)0x0;
        local_148._M_string_length = 1;
        local_148.field_2._M_allocated_capacity = (long)&local_148.field_2 + 8;
        local_148.field_2._M_local_buf[8] = 0x5f;
        local_100._0_8_ = (pointer)0x1;
        local_100._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_100._24_8_ = local_168._8_8_;
        local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_168._0_8_;
        local_d8 = (string *)0x0;
        views_03._M_len = 2;
        views_03._M_array = (iterator)local_100;
        local_100._8_8_ = local_148.field_2._M_allocated_capacity;
        cmCatViews((string *)local_88,views_03);
        std::__cxx11::string::operator=((string *)suffix,(string *)local_88);
        if ((string *)local_88._0_8_ != (string *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_168 + 0x10)) {
        operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
      }
    }
    uVar12 = uVar12 + 0x20;
    psVar10 = loc->Value;
    _Var4._M_p = local_148._M_dataplus._M_p;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_string_length;
    local_148._M_string_length = local_a8._M_allocated_capacity;
    local_148._M_dataplus._M_p = (pointer)local_a8._8_8_;
  } while( true );
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config, cmValue& loc,
                               cmValue& imp, std::string& suffix) const
{
  std::string config_upper;
  if (!desired_config.empty()) {
    config_upper = cmSystemTools::UpperCase(desired_config);
  }

  std::string locPropBase;
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    locPropBase = "IMPORTED_LIBNAME";
  } else if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    locPropBase = "IMPORTED_OBJECTS";
  } else {
    locPropBase = "IMPORTED_LOCATION";
  }

  // Track the configuration-specific property suffix.
  suffix = cmStrCat('_', config_upper);

  cmList mappedConfigs;
  {
    std::string mapProp = cmStrCat("MAP_IMPORTED_CONFIG_", config_upper);
    if (cmValue mapValue = this->GetProperty(mapProp)) {
      mappedConfigs.assign(*mapValue, cmList::EmptyElements::Yes);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // There may be only IMPORTED_IMPLIB for a shared library or an executable
  // with exports.
  bool allowImp = (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
                   this->IsExecutableWithExports()) ||
    (this->IsAIX() && this->IsExecutableWithExports()) ||
    (this->GetMakefile()->PlatformSupportsAppleTextStubs() &&
     this->IsSharedLibraryWithExports());

  // If a mapping was found, check its configurations.
  for (auto mci = mappedConfigs.begin();
       !loc && !imp && mci != mappedConfigs.end(); ++mci) {
    // Look for this configuration.
    if (mci->empty()) {
      // An empty string in the mapping has a special meaning:
      // look up the config-less properties.
      loc = this->GetProperty(locPropBase);
      if (allowImp) {
        imp = this->GetProperty("IMPORTED_IMPLIB");
      }
      // If it was found, set the suffix.
      if (loc || imp) {
        suffix.clear();
      }
    } else {
      std::string mcUpper = cmSystemTools::UpperCase(*mci);
      std::string locProp = cmStrCat(locPropBase, '_', mcUpper);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB_", mcUpper);
        imp = this->GetProperty(impProp);
      }

      // If it was found, use it for all properties below.
      if (loc || imp) {
        suffix = cmStrCat('_', mcUpper);
      }
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // then the target location is not found.  The project does not want
  // any other configuration.
  if (!mappedConfigs.empty() && !loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if (!loc && !imp) {
    std::string locProp = cmStrCat(locPropBase, suffix);
    loc = this->GetProperty(locProp);
    if (allowImp) {
      std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
      imp = this->GetProperty(impProp);
    }
  }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if (!loc && !imp) {
    // The suffix computed above is not useful.
    suffix.clear();

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    loc = this->GetProperty(locPropBase);
    if (allowImp) {
      imp = this->GetProperty("IMPORTED_IMPLIB");
    }
  }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if (!loc && !imp) {
    cmList availableConfigs;
    if (cmValue iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS")) {
      availableConfigs.assign(*iconfigs);
    }
    for (auto aci = availableConfigs.begin();
         !loc && !imp && aci != availableConfigs.end(); ++aci) {
      suffix = cmStrCat('_', cmSystemTools::UpperCase(*aci));
      std::string locProp = cmStrCat(locPropBase, suffix);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
        imp = this->GetProperty(impProp);
      }
    }
  }
  // If we have not yet found it then the target location is not available.
  if (!loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  return true;
}